

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  u8 uVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Column *pCVar5;
  Column *pCVar6;
  char *zLeft;
  char *zRight;
  long lVar7;
  long lVar8;
  Schema *pSVar9;
  char **ppcVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  int iCur;
  int iVar14;
  int iVar15;
  Trigger *pTVar16;
  Table *pTab;
  Vdbe *p;
  Index *pIVar17;
  int iVar18;
  Schema **ppSVar19;
  Op *pOVar20;
  Index *pSrc;
  byte bVar21;
  u16 uVar22;
  long lVar23;
  ulong uVar24;
  Index *local_70;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  int local_40;
  int local_3c;
  
  if (pSelect == (Select *)0x0) {
    return 0;
  }
  if (pParse->pWith != (With *)0x0) {
    return 0;
  }
  if (pSelect->pWith != (With *)0x0) {
    return 0;
  }
  psVar3 = pParse->db;
  pTVar16 = sqlite3TriggerList((Parse *)psVar3->aDb[1].pSchema,
                               (Table *)(ulong)pParse->disableTriggers);
  if (pTVar16 != (Trigger *)0x0) {
    return 0;
  }
  if (pDest->nModuleArg != 0) {
    return 0;
  }
  if (onError == 0xb) {
    if ((pDest->iPKey < 0) || (pDest->keyConf == 0xb)) {
      onError = 2;
    }
    else {
      onError = (int)pDest->keyConf;
    }
  }
  pSVar4 = pSelect->pSrc;
  if (pSVar4->nSrc != 1) {
    return 0;
  }
  if (pSVar4->a[0].pSelect != (Select *)0x0) {
    return 0;
  }
  if (pSelect->pWhere != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pOrderBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pGroupBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pLimit != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pPrior != (Select *)0x0) {
    return 0;
  }
  if ((pSelect->selFlags & 1) != 0) {
    return 0;
  }
  if (pSelect->pEList->nExpr != 1) {
    return 0;
  }
  if ((pSelect->pEList->a[0].pExpr)->op != 0xac) {
    return 0;
  }
  pTab = sqlite3LocateTableItem(pParse,0,pSVar4->a);
  if (pTab == (Table *)0x0) {
    return 0;
  }
  if ((pTab->tnum == pDest->tnum) && (pTab->pSchema == pDest->pSchema)) {
    return 0;
  }
  if (((pTab->tabFlags ^ pDest->tabFlags) & 0x20) != 0) {
    return 0;
  }
  if (pTab->nModuleArg != 0) {
    return 0;
  }
  if (pTab->pSelect != (Select *)0x0) {
    return 0;
  }
  uVar2 = pDest->nCol;
  if (uVar2 != pTab->nCol) {
    return 0;
  }
  if (pDest->iPKey != pTab->iPKey) {
    return 0;
  }
  if (0 < (short)uVar2) {
    pCVar5 = pDest->aCol;
    pCVar6 = pTab->aCol;
    lVar23 = 0;
    do {
      if ((&pCVar5->affinity)[lVar23] != (&pCVar6->affinity)[lVar23]) {
        return 0;
      }
      zLeft = *(char **)((long)&pCVar5->zColl + lVar23);
      zRight = *(char **)((long)&pCVar6->zColl + lVar23);
      if (zLeft == (char *)0x0) {
        iVar13 = -(uint)(zRight != (char *)0x0);
      }
      else {
        if (zRight == (char *)0x0) {
          return 0;
        }
        iVar13 = sqlite3StrICmp(zLeft,zRight);
      }
      if (iVar13 != 0) {
        return 0;
      }
      if (((&pCVar5->notNull)[lVar23] != '\0') && ((&pCVar6->notNull)[lVar23] == '\0')) {
        return 0;
      }
      if (lVar23 != 0) {
        lVar7 = *(long *)((long)&pCVar5->pDflt + lVar23);
        lVar8 = *(long *)((long)&pCVar6->pDflt + lVar23);
        if ((lVar7 == 0) == (lVar8 != 0)) {
          return 0;
        }
        if ((lVar7 != 0) &&
           (iVar13 = strcmp(*(char **)(lVar7 + 8),*(char **)(lVar8 + 8)), iVar13 != 0)) {
          return 0;
        }
      }
      lVar23 = lVar23 + 0x20;
    } while ((ulong)uVar2 << 5 != lVar23);
  }
  local_70 = pDest->pIndex;
  if (local_70 == (Index *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = false;
    do {
      if (local_70->onError != '\0') {
        bVar11 = true;
      }
      pIVar17 = pTab->pIndex;
      while( true ) {
        if (pIVar17 == (Index *)0x0) {
          return 0;
        }
        iVar13 = xferCompatibleIndex(local_70,pIVar17);
        if (iVar13 != 0) break;
        pIVar17 = pIVar17->pNext;
      }
      if ((pIVar17->tnum == local_70->tnum) && (pTab->pSchema == pDest->pSchema)) {
        if (sqlite3Config.xTestCallback == (_func_int_int *)0x0) {
          return 0;
        }
        iVar13 = (*sqlite3Config.xTestCallback)(0x19b);
        if (iVar13 == 0) {
          return 0;
        }
      }
      local_70 = local_70->pNext;
    } while (local_70 != (Index *)0x0);
  }
  if ((pDest->pCheck != (ExprList *)0x0) &&
     (iVar13 = sqlite3ExprListCompare(pTab->pCheck,pDest->pCheck,-1), iVar13 != 0)) {
    return 0;
  }
  cVar12 = (char)psVar3->flags;
  if (((uint)psVar3->flags >> 0xe & 1) == 0) {
    if (cVar12 < '\0') {
      return 0;
    }
  }
  else {
    if (cVar12 < '\0') {
      return 0;
    }
    if (pDest->pFKey != (FKey *)0x0) {
      return 0;
    }
  }
  if (pTab->pSchema == (Schema *)0x0) {
    local_54 = -1000000;
  }
  else {
    local_54 = -1;
    ppSVar19 = &psVar3->aDb->pSchema;
    do {
      local_54 = local_54 + 1;
      pSVar9 = *ppSVar19;
      ppSVar19 = ppSVar19 + 4;
    } while (pSVar9 != pTab->pSchema);
  }
  p = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse,local_54);
  iVar13 = pParse->nTab;
  iCur = iVar13 + 1;
  pParse->nTab = iVar13 + 2;
  iVar14 = autoIncBegin(pParse,iDbDest,pDest);
  uVar1 = pParse->nTempReg;
  if (uVar1 == '\0') {
    local_64 = pParse->nMem + 1;
    pParse->nMem = local_64;
  }
  else {
    bVar21 = uVar1 - 1;
    pParse->nTempReg = bVar21;
    local_64 = pParse->aTempReg[bVar21];
    if (bVar21 != 0) {
      pParse->nTempReg = uVar1 - 2;
      local_68 = pParse->aTempReg[(byte)(uVar1 - 2)];
      goto LAB_0019171b;
    }
  }
  local_68 = pParse->nMem + 1;
  pParse->nMem = local_68;
LAB_0019171b:
  sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x6d);
  local_3c = 0;
  if (((psVar3->mDbFlags & 4) == 0) &&
     ((((pDest->iPKey < 0 && (pDest->pIndex != (Index *)0x0)) || (bVar11)) ||
      (onError - 3U < 0xfffffffe)))) {
    iVar15 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
    local_3c = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    if (p->db->mallocFailed == '\0') {
      iVar18 = p->nOp + -1;
      if (-1 < iVar15) {
        iVar18 = iVar15;
      }
      pOVar20 = p->aOp + iVar18;
    }
    else {
      pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar20->p2 = p->nOp;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    sqlite3OpenTable(pParse,iVar13,local_54,pTab,0x6c);
    local_40 = sqlite3VdbeAddOp3(p,0x24,iVar13,0,0);
    if (pDest->iPKey < 0) {
      if ((pDest->pIndex == (Index *)0x0) && ((psVar3->mDbFlags & 8) == 0)) {
        iVar15 = 0x79;
        iVar14 = iCur;
      }
      else {
        iVar15 = 0x80;
        iVar14 = iVar13;
      }
      local_50 = sqlite3VdbeAddOp3(p,iVar15,iVar14,local_68,0);
    }
    else {
      local_50 = sqlite3VdbeAddOp3(p,0x80,iVar13,local_68,0);
      iVar15 = sqlite3VdbeAddOp3(p,0x1f,iCur,0,local_68);
      sqlite3RowidConstraint(pParse,onError,pDest);
      if (p->db->mallocFailed == '\0') {
        iVar18 = p->nOp + -1;
        if (-1 < iVar15) {
          iVar18 = iVar15;
        }
        pOVar20 = p->aOp + iVar18;
      }
      else {
        pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar20->p2 = p->nOp;
      if (0 < iVar14) {
        sqlite3VdbeAddOp3(pParse->pVdbe,0x97,iVar14,local_68,0);
      }
    }
    sqlite3VdbeAddOp3(p,0x7f,iVar13,local_64,1);
    uVar22 = 0x29;
    if ((psVar3->mDbFlags & 4) != 0) {
      sqlite3VdbeAddOp3(p,0x82,iCur,0,0);
      uVar22 = 0x39;
    }
    iVar14 = sqlite3VdbeAddOp3(p,0x7a,iCur,local_64,local_68);
    sqlite3VdbeChangeP4(p,iVar14,(char *)pDest,-6);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = uVar22;
    }
    sqlite3VdbeAddOp3(p,5,iVar13,local_50,0);
    sqlite3VdbeAddOp3(p,0x75,iVar13,0,0);
    sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
  }
  else {
    sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',pDest->zName);
    local_40 = 0;
    sqlite3TableLock(pParse,local_54,pTab->tnum,'\0',pTab->zName);
  }
  pIVar17 = pDest->pIndex;
  do {
    if (pIVar17 == (Index *)0x0) {
      if (local_40 != 0) {
        if (p->db->mallocFailed == '\0') {
          iVar13 = p->nOp + -1;
          if (-1 < local_40) {
            iVar13 = local_40;
          }
          pOVar20 = p->aOp + iVar13;
        }
        else {
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar20->p2 = p->nOp;
      }
      if (local_68 != 0) {
        bVar21 = pParse->nTempReg;
        if ((ulong)bVar21 < 8) {
          pParse->nTempReg = bVar21 + 1;
          pParse->aTempReg[bVar21] = local_68;
        }
      }
      if (local_64 != 0) {
        bVar21 = pParse->nTempReg;
        if ((ulong)bVar21 < 8) {
          pParse->nTempReg = bVar21 + 1;
          pParse->aTempReg[bVar21] = local_64;
        }
      }
      if (local_3c == 0) {
        iVar13 = 1;
      }
      else {
        if (pParse->pAinc != (AutoincInfo *)0x0) {
          autoIncrementEnd(pParse);
        }
        iVar13 = 0;
        sqlite3VdbeAddOp3(p,0x45,0,0,0);
        if (p->db->mallocFailed == '\0') {
          iVar14 = p->nOp + -1;
          if (-1 < local_3c) {
            iVar14 = local_3c;
          }
          pOVar20 = p->aOp + iVar14;
        }
        else {
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar20->p2 = p->nOp;
        sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
      }
      return iVar13;
    }
    for (pSrc = pTab->pIndex; pSrc != (Index *)0x0; pSrc = pSrc->pNext) {
      iVar14 = xferCompatibleIndex(pIVar17,pSrc);
      if (iVar14 != 0) goto LAB_00191a7b;
    }
    pSrc = (Index *)0x0;
LAB_00191a7b:
    sqlite3VdbeAddOp3(p,0x6c,iVar13,pSrc->tnum,local_54);
    sqlite3VdbeSetP4KeyInfo(pParse,pSrc);
    sqlite3VdbeAddOp3(p,0x6d,iCur,pIVar17->tnum,iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse,pIVar17);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 1;
    }
    uVar24 = 0;
    iVar14 = sqlite3VdbeAddOp3(p,0x24,iVar13,0,0);
    sqlite3VdbeAddOp3(p,0x7f,iVar13,local_64,1);
    if ((psVar3->mDbFlags & 4) != 0) {
      uVar2 = pSrc->nColumn;
      if (uVar2 == 0) {
LAB_00191b79:
        if ((uint)uVar24 != (uint)uVar2) {
          uVar24 = 0;
          goto LAB_00191b9e;
        }
      }
      else {
        ppcVar10 = pSrc->azColl;
        uVar24 = 0;
        do {
          if ((ppcVar10[uVar24] == (char *)0x0) ||
             (iVar15 = sqlite3StrICmp("BINARY",ppcVar10[uVar24]), iVar15 != 0)) goto LAB_00191b79;
          uVar24 = uVar24 + 1;
        } while ((uint)uVar2 != uVar24);
      }
      sqlite3VdbeAddOp3(p,0x82,iCur,0,0);
      uVar24 = 0x10;
    }
LAB_00191b9e:
    bVar21 = (byte)uVar24;
    if ((pTab->tabFlags & 0x20) != 0) {
      bVar21 = bVar21 | (*(ushort *)&pIVar17->field_0x63 & 3) == 2;
    }
    sqlite3VdbeAddOp3(p,0x84,iCur,local_64,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)(bVar21 | 8);
    }
    sqlite3VdbeAddOp3(p,5,iVar13,iVar14 + 1,0);
    pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      iVar15 = p->nOp + -1;
      if (-1 < iVar14) {
        iVar15 = iVar14;
      }
      pOVar20 = p->aOp + iVar15;
    }
    pOVar20->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x75,iVar13,0,0);
    sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
    pIVar17 = pIVar17->pNext;
  } while( true );
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  struct SrcList_item *pItem;      /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  if( pSelect==0 ){
    return 0;   /* Must be of the form  INSERT INTO ... SELECT ... */
  }
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
  if( sqlite3TriggerList(pParse, pDest) ){
    return 0;   /* tab1 must not have triggers */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc->tnum==pDest->tnum && pSrc->pSchema==pDest->pSchema ){
    testcase( pSrc!=pDest ); /* Possible due to bad sqlite_master.rootpage */
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pSrc) ){
    return 0;   /* tab2 must not be a virtual table */
  }
#endif
  if( pSrc->pSelect ){
    return 0;   /* tab2 may not be a view */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN 
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(pDestCol->zColl, pSrcCol->zColl)!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( i>0 ){
      assert( pDestCol->pDflt==0 || pDestCol->pDflt->op==TK_SPAN );
      assert( pSrcCol->pDflt==0 || pSrcCol->pDflt->op==TK_SPAN );
      if( (pDestCol->pDflt==0)!=(pSrcCol->pDflt==0) 
       || (pDestCol->pDflt && strcmp(pDestCol->pDflt->u.zToken,
                                       pSrcCol->pDflt->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
    if( pSrcIdx->tnum==pDestIdx->tnum && pSrc->pSchema==pDest->pSchema
         && sqlite3FaultSim(411)==SQLITE_OK ){
      /* The sqlite3FaultSim() call allows this corruption test to be
      ** bypassed during testing, in order to exercise other corruption tests
      ** further downstream. */
      return 0;   /* Corrupt schema - two indexes on the same btree */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM 
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization 
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      sqlite3VdbeVerifyAbortable(v, onError);
      addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
      VdbeCoverage(v);
      sqlite3RowidConstraint(pParse, onError, pDest);
      sqlite3VdbeJumpHere(v, addr2);
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 && !(db->mDbFlags & DBFLAG_VacuumInto) ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|
                           OPFLAG_APPEND|OPFLAG_USESEEKRESULT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND;
    }
    sqlite3VdbeAddOp4(v, OP_Insert, iDest, regData, regRowid,
                      (char*)pDest, P4_TABLE);
    sqlite3VdbeChangeP5(v, insFlags);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted 
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key 
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user 
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      }
    }
    if( !HasRowid(pSrc) && pDestIdx->idxType==SQLITE_IDXTYPE_PRIMARYKEY ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}